

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ReusableStringStream rss;
  string local_50;
  ReusableStringStream local_30;
  
  ReusableStringStream::ReusableStringStream(&local_30);
  std::operator<<(local_30.m_oss,"Approx( ");
  stringify<double>(&local_50,&this->m_value);
  std::operator<<(local_30.m_oss,(string *)&local_50);
  std::operator<<(local_30.m_oss," )");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }